

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

nghttp2_ssize
session_call_select_padding(nghttp2_session *session,nghttp2_frame *frame,size_t max_payloadlen)

{
  size_t sVar1;
  ulong in_RDX;
  ulong *in_RSI;
  long in_RDI;
  size_t max_paddedlen;
  nghttp2_ssize rv;
  undefined8 local_28;
  undefined8 local_8;
  
  if ((*in_RSI < in_RDX) && ((*(long *)(in_RDI + 0x9b0) != 0 || (*(long *)(in_RDI + 0x9a8) != 0))))
  {
    sVar1 = nghttp2_min_size(*in_RSI + 0x100,in_RDX);
    if (*(long *)(in_RDI + 0x9b0) == 0) {
      local_28 = (**(code **)(in_RDI + 0x9a8))(in_RDI,in_RSI,sVar1,*(undefined8 *)(in_RDI + 0xa30));
    }
    else {
      local_28 = (**(code **)(in_RDI + 0x9b0))(in_RDI,in_RSI,sVar1,*(undefined8 *)(in_RDI + 0xa30));
    }
    if (((long)local_28 < (long)*in_RSI) || ((long)sVar1 < (long)local_28)) {
      local_8 = 0xfffffffffffffc7a;
    }
    else {
      local_8 = local_28;
    }
  }
  else {
    local_8 = *in_RSI;
  }
  return local_8;
}

Assistant:

static nghttp2_ssize session_call_select_padding(nghttp2_session *session,
                                                 const nghttp2_frame *frame,
                                                 size_t max_payloadlen) {
  nghttp2_ssize rv;
  size_t max_paddedlen;

  if (frame->hd.length >= max_payloadlen ||
      (!session->callbacks.select_padding_callback2 &&
       !session->callbacks.select_padding_callback)) {
    return (nghttp2_ssize)frame->hd.length;
  }

  max_paddedlen =
    nghttp2_min_size(frame->hd.length + NGHTTP2_MAX_PADLEN, max_payloadlen);

  if (session->callbacks.select_padding_callback2) {
    rv = session->callbacks.select_padding_callback2(
      session, frame, max_paddedlen, session->user_data);
  } else {
    rv = (nghttp2_ssize)session->callbacks.select_padding_callback(
      session, frame, max_paddedlen, session->user_data);
  }
  if (rv < (nghttp2_ssize)frame->hd.length ||
      rv > (nghttp2_ssize)max_paddedlen) {
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }
  return rv;
}